

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_psx_Mapping.cpp
# Opt level: O0

void * __thiscall
axl::io::psx::Mapping::map
          (Mapping *this,void *addrHint,size_t size,int protection,uint_t flags,int fd,size_t offset
          )

{
  void *pvVar1;
  int in_ECX;
  size_t in_RDX;
  void *in_RSI;
  Mapping *in_RDI;
  int in_R8D;
  int in_R9D;
  __off_t in_stack_00000008;
  void *p;
  void *local_8;
  
  close(in_RDI,(int)in_RSI);
  pvVar1 = mmap(in_RSI,in_RDX,in_ECX,in_R8D,in_R9D,in_stack_00000008);
  if (pvVar1 == (void *)0xffffffffffffffff) {
    err::setLastSystemError();
    local_8 = (void *)0x0;
  }
  else {
    in_RDI->m_p = pvVar1;
    in_RDI->m_size = in_RDX;
    local_8 = in_RDI->m_p;
  }
  return local_8;
}

Assistant:

void*
Mapping::map(
	void* addrHint,
	size_t size,
	int protection,
	uint_t flags,
	int fd,
	size_t offset
) {
	close();

	void* p = ::mmap(addrHint, size, protection, flags, fd, offset);
	if (p == (void*)-1) {
		err::setLastSystemError();
		return NULL;
	}

	m_p = p;
	m_size = size;
	return m_p;
}